

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void __thiscall TokenFilter::handleToken(TokenFilter *this,Token *t)

{
  bool bVar1;
  allocator<char> local_a9;
  string local_a8 [32];
  Token local_88 [104];
  
  std::__cxx11::string::string<std::allocator<char>>(local_a8,"Potato",&local_a9);
  QPDFTokenizer::Token::Token(local_88,tt_string,local_a8);
  bVar1 = QPDFTokenizer::Token::operator==(t,local_88);
  QPDFTokenizer::Token::~Token(local_88);
  std::__cxx11::string::~string(local_a8);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>(local_a8,"Salad",&local_a9);
    QPDFTokenizer::Token::Token(local_88,tt_string,local_a8);
    QPDFObjectHandle::TokenFilter::writeToken((Token *)this);
    QPDFTokenizer::Token::~Token(local_88);
    std::__cxx11::string::~string(local_a8);
  }
  else {
    QPDFObjectHandle::TokenFilter::writeToken((Token *)this);
  }
  return;
}

Assistant:

void
    handleToken(QPDFTokenizer::Token const& t) override
    {
        if (t == QPDFTokenizer::Token(QPDFTokenizer::tt_string, "Potato")) {
            // Exercise unparsing of strings by token constructor
            writeToken(QPDFTokenizer::Token(QPDFTokenizer::tt_string, "Salad"));
        } else {
            writeToken(t);
        }
    }